

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O1

void nn_msgqueue_init(nn_msgqueue *self,size_t maxmem)

{
  int iVar1;
  nn_msgqueue_chunk *pnVar2;
  nn_msgqueue *self_00;
  nn_msg nStack_78;
  nn_msgqueue *pnStack_18;
  
  self->count = 0;
  self->mem = 0;
  self->maxmem = maxmem;
  self_00 = (nn_msgqueue *)0x2f48;
  pnVar2 = (nn_msgqueue_chunk *)nn_alloc_(0x2f48);
  if (pnVar2 != (nn_msgqueue_chunk *)0x0) {
    pnVar2->next = (nn_msgqueue_chunk *)0x0;
    (self->out).chunk = pnVar2;
    (self->out).pos = 0;
    (self->in).chunk = pnVar2;
    (self->in).pos = 0;
    self->cache = (nn_msgqueue_chunk *)0x0;
    return;
  }
  nn_msgqueue_init_cold_1();
  pnStack_18 = self;
  iVar1 = nn_msgqueue_recv(self_00,&nStack_78);
  if (iVar1 != -0xb) {
    do {
      if (iVar1 < 0) {
        nn_msgqueue_term_cold_1();
        goto LAB_00129ba0;
      }
      nn_msg_term(&nStack_78);
      iVar1 = nn_msgqueue_recv(self_00,&nStack_78);
    } while (iVar1 != -0xb);
  }
  pnVar2 = (self_00->in).chunk;
  if (pnVar2 == (self_00->out).chunk) {
    nn_free(pnVar2);
    if (self_00->cache != (nn_msgqueue_chunk *)0x0) {
      nn_free(self_00->cache);
    }
    return;
  }
LAB_00129ba0:
  nn_msgqueue_term_cold_2();
  return;
}

Assistant:

void nn_msgqueue_init (struct nn_msgqueue *self, size_t maxmem)
{
    struct nn_msgqueue_chunk *chunk;

    self->count = 0;
    self->mem = 0;
    self->maxmem = maxmem;

    chunk = nn_alloc (sizeof (struct nn_msgqueue_chunk), "msgqueue chunk");
    alloc_assert (chunk);
    chunk->next = NULL;

    self->out.chunk = chunk;
    self->out.pos = 0;
    self->in.chunk = chunk;
    self->in.pos = 0;

    self->cache = NULL;
}